

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O2

void __thiscall testbench::anon_unknown_0::destroyer::~destroyer(destroyer *this)

{
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> *this_00;
  
  this_00 = (anonymous_namespace)::machines;
  if ((anonymous_namespace)::machines !=
      (_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)0x0) {
    std::_Vector_base<testbench::machine_*(*)(),_std::allocator<testbench::machine_*(*)()>_>::
    ~_Vector_base((_Vector_base<testbench::machine_*(*)(),_std::allocator<testbench::machine_*(*)()>_>
                   *)((anonymous_namespace)::machines + 1));
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(this_00);
    operator_delete(this_00,0x30);
    return;
  }
  return;
}

Assistant:

~destroyer()
    {
        if (machines != nullptr) {
            delete machines;
        }
    }